

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O2

void aiMultiplyMatrix3(aiMatrix3x3 *dst,aiMatrix3x3 *src)

{
  aiMatrix3x3t<float> temp;
  aiMatrix3x3t<float> local_38;
  
  if (dst == (aiMatrix3x3 *)0x0) {
    __assert_fail("__null != dst",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                  ,0x28d,"void aiMultiplyMatrix3(aiMatrix3x3 *, const aiMatrix3x3 *)");
  }
  if (src != (aiMatrix3x3 *)0x0) {
    local_38.c3 = dst->c3;
    local_38.a1 = dst->a1;
    local_38.a2 = dst->a2;
    local_38.a3 = dst->a3;
    local_38.b1 = dst->b1;
    local_38.b2 = dst->b2;
    local_38.b3 = dst->b3;
    local_38.c1 = dst->c1;
    local_38.c2 = dst->c2;
    aiMatrix3x3t<float>::operator*=(&local_38,src);
    dst->a1 = local_38.a1;
    dst->a2 = local_38.a2;
    dst->a3 = local_38.a3;
    dst->b1 = local_38.b1;
    dst->b2 = local_38.b2;
    dst->b3 = local_38.b3;
    dst->c1 = local_38.c1;
    dst->c2 = local_38.c2;
    dst->c3 = local_38.c3;
    return;
  }
  __assert_fail("__null != src",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                ,0x28e,"void aiMultiplyMatrix3(aiMatrix3x3 *, const aiMatrix3x3 *)");
}

Assistant:

ASSIMP_API void aiMultiplyMatrix3(
    aiMatrix3x3* dst,
    const aiMatrix3x3* src)
{
    ai_assert( NULL != dst );
    ai_assert( NULL != src );
    *dst = (*dst) * (*src);
}